

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InstructionFolder::FoldInstruction(InstructionFolder *this,Instruction *inst)

{
  bool bVar1;
  bool bVar2;
  
  if (inst->opcode_ == OpCopyObject) {
    bVar1 = false;
  }
  else {
    bVar1 = FoldInstructionInternal(this,inst);
    bVar2 = bVar1;
    while ((bVar2 != false && (inst->opcode_ != OpCopyObject))) {
      bVar2 = FoldInstructionInternal(this,inst);
    }
  }
  return bVar1;
}

Assistant:

bool InstructionFolder::FoldInstruction(Instruction* inst) const {
  bool modified = false;
  Instruction* folded_inst(inst);
  while (folded_inst->opcode() != spv::Op::OpCopyObject &&
         FoldInstructionInternal(&*folded_inst)) {
    modified = true;
  }
  return modified;
}